

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactor<double>::solveLleft
          (CLUFactor<double> *this,double eps,double *vec,int *nonz,int rn)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  double *pdVar21;
  uint uVar22;
  ulong uVar23;
  int *piVar24;
  ulong uVar25;
  double dVar26;
  
  if (rn < 1) {
    return 0;
  }
  pdVar5 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->l).ridx;
  piVar7 = (this->l).rbeg;
  piVar8 = (this->l).rorig;
  piVar9 = (this->l).rperm;
  uVar23 = 0;
  do {
    iVar14 = piVar9[nonz[uVar23]];
    if (uVar23 == 0) {
      lVar12 = 0;
    }
    else {
      uVar25 = uVar23 & 0xffffffff;
      do {
        uVar16 = (uint)uVar25 - 1;
        uVar11 = uVar16 >> 1;
        uVar22 = (uint)uVar25;
        if (iVar14 <= nonz[uVar11]) break;
        nonz[uVar25] = nonz[uVar11];
        uVar25 = (ulong)uVar11;
        uVar22 = uVar11;
      } while (1 < uVar16);
      lVar12 = (long)(int)uVar22;
    }
    uVar23 = uVar23 + 1;
    nonz[lVar12] = iVar14;
  } while (uVar23 != (uint)rn);
  if (rn < 1) {
    iVar14 = 0;
  }
  else {
    piVar15 = nonz + this->thedim;
    iVar14 = 0;
    do {
      iVar2 = *nonz;
      uVar22 = rn - 1;
      uVar23 = (ulong)uVar22;
      iVar3 = nonz[uVar23];
      iVar20 = 1;
      iVar13 = 0;
      if (3 < (uint)rn) {
        iVar13 = 0;
        do {
          iVar4 = nonz[iVar20];
          iVar17 = nonz[(long)iVar20 + 1];
          if (iVar17 < iVar4) {
            iVar19 = iVar20;
            iVar17 = iVar4;
            if (iVar4 <= iVar3) goto LAB_00207163;
          }
          else {
            if (iVar17 <= iVar3) goto LAB_00207163;
            iVar19 = iVar20 + 1;
          }
          nonz[iVar13] = iVar17;
          iVar20 = iVar19 * 2 + 1;
          iVar13 = iVar19;
        } while (iVar20 < (int)(rn - 2U));
      }
      if ((iVar20 < (int)uVar22) && (iVar3 < nonz[iVar20])) {
        nonz[iVar13] = nonz[iVar20];
        iVar13 = iVar20;
      }
LAB_00207163:
      nonz[iVar13] = iVar3;
      iVar2 = piVar8[iVar2];
      dVar1 = vec[iVar2];
      rn = uVar22;
      if (ABS(dVar1) <= eps) {
        vec[iVar2] = 0.0;
      }
      else {
        piVar15[-1] = iVar2;
        piVar15 = piVar15 + -1;
        iVar14 = iVar14 + 1;
        iVar3 = piVar7[iVar2];
        iVar2 = piVar7[(long)iVar2 + 1];
        iVar13 = iVar2 - iVar3;
        if (iVar13 != 0 && iVar3 <= iVar2) {
          piVar24 = piVar6 + iVar3;
          pdVar21 = pdVar5 + iVar3;
          do {
            uVar22 = (uint)uVar23;
            iVar2 = *piVar24;
            dVar26 = vec[iVar2];
            if ((dVar26 != 0.0) || (NAN(dVar26))) {
              dVar26 = dVar26 - *pdVar21 * dVar1;
              uVar25 = -(ulong)(dVar26 != 0.0);
              vec[iVar2] = (double)(~uVar25 & 0x2b2bff2ee48e0530 | (ulong)dVar26 & uVar25);
            }
            else {
              dVar26 = *pdVar21 * -dVar1;
              if (eps < ABS(dVar26)) {
                vec[iVar2] = dVar26;
                iVar2 = piVar9[iVar2];
                uVar11 = uVar22;
                if (0 < (int)uVar22) {
                  do {
                    uVar18 = (uint)uVar23 - 1;
                    uVar16 = uVar18 >> 1;
                    uVar11 = (uint)uVar23;
                    if (iVar2 <= nonz[uVar16]) break;
                    nonz[uVar23] = nonz[uVar16];
                    uVar23 = (ulong)uVar16;
                    uVar11 = uVar16;
                  } while (1 < uVar18);
                }
                uVar23 = (ulong)(uVar22 + 1);
                nonz[(int)uVar11] = iVar2;
              }
            }
            rn = (int)uVar23;
            piVar24 = piVar24 + 1;
            pdVar21 = pdVar21 + 1;
            bVar10 = 1 < iVar13;
            iVar13 = iVar13 + -1;
          } while (bVar10);
        }
      }
    } while (0 < rn);
    if (0 < iVar14) {
      lVar12 = 0;
      do {
        nonz[lVar12] = piVar15[lVar12];
        lVar12 = lVar12 + 1;
      } while (iVar14 != (int)lVar12);
    }
  }
  return iVar14;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}